

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

iterator __thiscall
google::protobuf::RepeatedField<long>::erase(RepeatedField<long> *this,const_iterator position)

{
  void *__dest;
  void *pvVar1;
  size_t __n;
  long lVar2;
  
  pvVar1 = this->arena_or_elements_;
  lVar2 = (long)(int)((ulong)((long)position - (long)pvVar1) >> 3);
  __dest = (void *)((long)pvVar1 + lVar2 * 8);
  __n = (long)pvVar1 + ((long)this->current_size_ * 8 - (long)(position + 1));
  if (__n != 0) {
    memmove(__dest,position + 1,__n);
  }
  if (0 < this->current_size_) {
    this->current_size_ = (int)((long)__dest + (__n - (long)this->arena_or_elements_) >> 3);
  }
  return (iterator)(lVar2 * 8 + (long)this->arena_or_elements_);
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator position) {
  return erase(position, position + 1);
}